

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O1

int16_t place_monster(chunk *c,loc_conflict grid,monster *mon,uint8_t origin)

{
  bitflag *flags;
  monster_drop *pmVar1;
  _Bool _Var2;
  _Bool _Var3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  uint8_t uVar7;
  short sVar8;
  wchar_t wVar9;
  uint32_t uVar10;
  monster *pmVar11;
  monster_conflict *mon_00;
  monster_conflict *pmVar12;
  monster_race *pmVar13;
  monster_lore *pmVar14;
  object_kind *k;
  object *poVar15;
  wchar_t wVar16;
  long lVar17;
  artifact *paVar18;
  wchar_t idx;
  ulong uVar19;
  wchar_t wVar20;
  _Bool local_6d;
  
  wVar9 = mon->midx;
  _Var2 = square_in_bounds((chunk_conflict *)c,(loc)grid);
  if (!_Var2) {
    __assert_fail("square_in_bounds(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-make.c"
                  ,0x3ef,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  pmVar11 = square_monster((chunk_conflict *)c,(loc)grid);
  if (pmVar11 != (monster *)0x0) {
    __assert_fail("!square_monster(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-make.c"
                  ,0x3f0,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  if (wVar9 < L'\x01') {
    sVar8 = mon_pop(c);
    if (sVar8 == 0) {
      return 0;
    }
  }
  else {
    sVar8 = (short)mon->midx;
    c->mon_max = c->mon_max + 1;
    c->mon_cnt = c->mon_cnt + 1;
  }
  idx = (wchar_t)sVar8;
  mon_00 = (monster_conflict *)cave_monster((chunk_conflict *)c,idx);
  memcpy(mon_00,mon,0x1a0);
  mon_00->midx = idx;
  square_set_mon((chunk_conflict *)c,(loc)grid,idx);
  (mon_00->grid).x = grid.x;
  (mon_00->grid).y = grid.y;
  pmVar12 = (monster_conflict *)square_monster((chunk_conflict *)c,(loc)grid);
  if (pmVar12 != mon_00) {
    __assert_fail("square_monster(c, grid) == new_mon",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-make.c"
                  ,0x406,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  monster_group_assign((chunk_conflict *)c,(monster *)mon_00,mon->group_info,L'\0' < wVar9);
  update_mon(mon_00,c,true);
  _Var2 = flag_has_dbg(mon_00->race->flags,0xb,0x11,"new_mon->race->flags","RF_MULTIPLY");
  if (_Var2) {
    c->num_repro = c->num_repro + L'\x01';
  }
  pmVar13 = mon_00->original_race;
  if (pmVar13 == (monster_race *)0x0) {
    pmVar13 = mon_00->race;
  }
  pmVar13->cur_num = pmVar13->cur_num + L'\x01';
  if (origin != '\0') {
    pmVar14 = get_lore(mon_00->race);
    pmVar13 = mon_00->original_race;
    if (pmVar13 == (monster_race *)0x0) {
      pmVar13 = mon_00->race;
    }
    flags = pmVar13->flags;
    _Var2 = flag_has_dbg(flags,0xb,0x26,"effective_race->flags","RF_DROP_GREAT");
    local_6d = true;
    if (!_Var2) {
      local_6d = flag_has_dbg(flags,0xb,0x25,"effective_race->flags","RF_DROP_GOOD");
    }
    _Var3 = flag_has_dbg(flags,0xb,0x1e,"effective_race->flags","RF_ONLY_ITEM");
    _Var4 = flag_has_dbg(flags,0xb,0x1d,"effective_race->flags","RF_ONLY_GOLD");
    wVar9 = mon_create_drop_count(pmVar13,false,false,(int *)0x0);
    _Var5 = monster_is_unique((monster *)mon_00);
    if ((_Var5) && (wVar20 = wVar9 - (uint)pmVar14->thefts, wVar9 = L'\0', L'\0' < wVar20)) {
      wVar9 = wVar20;
    }
    wVar20 = pmVar13->level;
    _Var5 = monster_is_unique((monster *)mon_00);
    wVar16 = wVar20;
    if (_Var5) {
      wVar16 = wVar20 * 2;
      if (wVar20 + L'\x0f' < wVar20 * 2) {
        wVar16 = wVar20 + L'\x0f';
      }
    }
    wVar20 = (c->depth + wVar16) / 2;
    if (wVar20 <= wVar16) {
      wVar20 = wVar16;
    }
    wVar16 = L'd';
    if (wVar20 < L'd') {
      wVar16 = wVar20;
    }
    _Var6 = flag_has_dbg(flags,0xb,2,"effective_race->flags","RF_QUESTOR");
    if (((_Var6) && (pmVar13->level == L'd')) && (1 < z_info->a_max)) {
      uVar19 = 1;
      lVar17 = 0x140;
      do {
        paVar18 = a_info;
        k = lookup_kind(*(wchar_t *)(a_info->flags + lVar17 + -0x28),
                        *(wchar_t *)(a_info->flags + lVar17 + -0x24));
        _Var6 = flag_has_dbg(k->kind_flags,2,5,"kind->kind_flags","KF_QUEST_ART");
        if (_Var6) {
          paVar18 = (artifact *)(paVar18->flags + lVar17 + -0x48);
          poVar15 = (object *)mem_zalloc(0x138);
          object_prep(poVar15,k,L'd',RANDOMISE);
          poVar15->artifact = paVar18;
          copy_artifact_data(poVar15,paVar18);
          mark_artifact_created(paVar18,true);
          poVar15->origin = origin;
          uVar7 = convert_depth_to_origin(c->depth);
          poVar15->origin_depth = uVar7;
          poVar15->origin_race = mon_00->race;
          poVar15->number = '\x01';
          _Var6 = monster_carry(c,mon_00,poVar15);
          if (!_Var6) {
            mark_artifact_created(poVar15->artifact,false);
            object_wipe(poVar15);
            mem_free(poVar15);
          }
        }
        uVar19 = uVar19 + 1;
        lVar17 = lVar17 + 0x140;
      } while (uVar19 < z_info->a_max);
    }
    for (pmVar1 = pmVar13->drops; pmVar1 != (monster_drop *)0x0; pmVar1 = pmVar1->next) {
      uVar10 = Rand_div(100);
      if (uVar10 < pmVar1->percent_chance) {
        if (pmVar1->kind == (object_kind *)0x0) {
          if (pmVar1->tval == L'\0') {
            __assert_fail("drop->tval",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-make.c"
                          ,0x34a,"_Bool mon_create_drop(struct chunk *, struct monster *, uint8_t)")
            ;
          }
          poVar15 = make_object(c,wVar16,local_6d,_Var2,_Var5,(int32_t *)0x0,pmVar1->tval);
        }
        else {
          poVar15 = (object *)mem_zalloc(0x138);
          object_prep(poVar15,pmVar1->kind,wVar16,RANDOMISE);
          apply_magic(poVar15,wVar16,true,local_6d,_Var2,_Var5);
        }
        if (poVar15 != (object *)0x0) {
          poVar15->origin = origin;
          uVar7 = convert_depth_to_origin(c->depth);
          poVar15->origin_depth = uVar7;
          poVar15->origin_race = pmVar13;
          uVar7 = '\x01';
          if (poVar15->artifact == (artifact *)0x0) {
            uVar10 = Rand_div(pmVar1->max - pmVar1->min);
            uVar7 = (char)uVar10 + (char)pmVar1->min;
          }
          poVar15->number = uVar7;
          _Var6 = monster_carry(c,mon_00,poVar15);
          if (!_Var6) {
            object_wipe(poVar15);
            mem_free(poVar15);
          }
        }
      }
    }
    if (L'\0' < wVar9) {
      do {
        if ((_Var3) || ((!_Var4 && (uVar10 = Rand_div(100), 0x31 < (int)uVar10)))) {
          poVar15 = make_object(c,wVar16,local_6d,_Var2,_Var5,(int32_t *)0x0,L'\0');
          if (poVar15 != (object *)0x0) goto LAB_001720d8;
        }
        else {
          poVar15 = make_gold(wVar16,"any");
LAB_001720d8:
          poVar15->origin = origin;
          uVar7 = convert_depth_to_origin(c->depth);
          poVar15->origin_depth = uVar7;
          poVar15->origin_race = pmVar13;
          _Var6 = monster_carry(c,mon_00,poVar15);
          if (!_Var6) {
            if (poVar15->artifact != (artifact *)0x0) {
              mark_artifact_created(poVar15->artifact,false);
            }
            object_wipe(poVar15);
            mem_free(poVar15);
          }
        }
        wVar9 = wVar9 + L'\xffffffff';
      } while (wVar9 != L'\0');
    }
    if (mon_00->race->mimic_kinds != (monster_mimic *)0x0) {
      mon_create_mimicked_object(c,(monster *)mon_00,idx);
    }
  }
  return sVar8;
}

Assistant:

int16_t place_monster(struct chunk *c, struct loc grid, struct monster *mon,
		uint8_t origin)
{
	int16_t m_idx;
	struct monster *new_mon;
	struct monster_group_info *info = mon->group_info;
	bool loading = mon->midx > 0;

	assert(square_in_bounds(c, grid));
	assert(!square_monster(c, grid));

	/* Get a new record, or recycle the old one */
	if (loading) {
		m_idx = mon->midx;
		c->mon_max++;
		c->mon_cnt++;
	} else {
		m_idx = mon_pop(c);
		if (!m_idx) return 0;
	}

	/* Copy the monster */
	new_mon = cave_monster(c, m_idx);
	memcpy(new_mon, mon, sizeof(struct monster));

	/* Set the ID */
	new_mon->midx = m_idx;

	/* Set the location */
	square_set_mon(c, grid, new_mon->midx);
	new_mon->grid = grid;
	assert(square_monster(c, grid) == new_mon);

	/* Assign monster to its monster group */
	monster_group_assign(c, new_mon, info, loading);

	update_mon(new_mon, c, true);

	/* Count the number of "reproducers" */
	if (rf_has(new_mon->race->flags, RF_MULTIPLY)) c->num_repro++;

	/* Count racial occurrences */
	if (new_mon->original_race) new_mon->original_race->cur_num++;
	else new_mon->race->cur_num++;

	/* Create the monster's drop, if any */
	if (origin)
		(void)mon_create_drop(c, new_mon, origin);

	/* Make mimics start mimicking */
	if (origin && new_mon->race->mimic_kinds) {
		mon_create_mimicked_object(c, new_mon, m_idx);
	}

	/* Result */
	return m_idx;
}